

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_append.c
# Opt level: O1

void * mpt_array_append(mpt_array *arr,size_t len,void *base)

{
  int *piVar1;
  mpt_buffer *pmVar2;
  void *pvVar3;
  ulong uVar4;
  
  pmVar2 = arr->_buf;
  if (pmVar2 == (mpt_buffer *)0x0) {
    uVar4 = 0;
    pmVar2 = _mpt_buffer_alloc(len,0);
LAB_001090c6:
    if (pmVar2 != (mpt_buffer *)0x0) {
      arr->_buf = pmVar2;
LAB_00109104:
      pvVar3 = (void *)((long)&pmVar2[1]._vptr + uVar4);
      if (len == 0) {
        return pvVar3;
      }
      pmVar2->_used = uVar4 + len;
      if (base == (void *)0x0) {
        pvVar3 = memset(pvVar3,0,len);
        return pvVar3;
      }
      pvVar3 = memcpy(pvVar3,base,len);
      return pvVar3;
    }
  }
  else {
    if (pmVar2->_content_traits == (mpt_type_traits *)0x0) {
      uVar4 = pmVar2->_used;
      if (len <= pmVar2->_size - uVar4) goto LAB_00109104;
      if (!CARRY8(uVar4,len)) {
        pmVar2 = (*pmVar2->_vptr->detach)(pmVar2,uVar4 + len);
        goto LAB_001090c6;
      }
    }
    piVar1 = __errno_location();
    *piVar1 = 0x16;
  }
  return (void *)0x0;
}

Assistant:

extern void *mpt_array_append(MPT_STRUCT(array) *arr, size_t len, const void *base)
{
	MPT_STRUCT(buffer) *b;
	size_t used;
	void *dest;
	
	if (!(b = arr->_buf)) {
		if (!(b = _mpt_buffer_alloc(len, 0))) {
			return 0;
		}
		used = 0;
		arr->_buf = b;
	}
	/* require raw buffer to append data */
	else if (b->_content_traits) {
		errno = EINVAL;
		return 0;
	}
	/* need more space */
	else if (len > (b->_size - (used = b->_used))) {
		if (len > (SIZE_MAX - used)) {
			errno = EINVAL;
			return 0;
		}
		if (!(b = b->_vptr->detach(b, used + len))) {
			return 0;
		}
		arr->_buf = b;
	}
	dest = ((uint8_t *)(b + 1)) + used;
	if (!len) {
		return dest;
	}
	
	b->_used = used + len;
	
	if (base) {
		memcpy(dest, base, len);
	} else {
		memset(dest, 0, len);
	}
	return dest;
}